

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerBailOnNotStackArgs(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  undefined8 uVar2;
  bool bVar3;
  IRKind IVar4;
  ValueType valueType;
  RejitException *this_00;
  Instr *pIVar5;
  IntConstOpnd *compareSrc2;
  bool local_89;
  Instr *ldLen;
  AutoReuseOpnd autoReuseldLenDstOpnd;
  RegOpnd *ldLenDstOpnd;
  Instr *instrNext;
  LabelInstr *continueLabelInstr;
  Instr *prevInstr;
  Instr *instr_local;
  Lowerer *this_local;
  
  bVar3 = Func::GetHasStackArgs(this->m_func);
  if (!bVar3) {
    this_00 = (RejitException *)__cxa_allocate_exception(1);
    Js::RejitException::RejitException(this_00,InlineApplyDisabled);
    __cxa_throw(this_00,&Js::RejitException::typeinfo,0);
  }
  pIVar1 = instr->m_prev;
  pIVar5 = instr->m_next;
  IVar4 = IR::Instr::GetKind(pIVar5);
  local_89 = true;
  if (IVar4 != InstrKindLabel) {
    local_89 = IR::Instr::IsProfiledLabelInstr(pIVar5);
  }
  if (local_89 == false) {
    instrNext = &IR::LabelInstr::New(Label,this->m_func,false)->super_Instr;
    IR::Instr::InsertAfter(instr,instrNext);
  }
  else {
    instrNext = &IR::Instr::AsLabelInstr(pIVar5)->super_Instr;
  }
  bVar3 = Func::IsInlinee(instr->m_func);
  if (bVar3) {
    IR::Instr::Remove(instr);
  }
  else {
    autoReuseldLenDstOpnd._16_8_ = IR::RegOpnd::New(TyUint32,instr->m_func);
    IR::AutoReuseOpnd::AutoReuseOpnd
              ((AutoReuseOpnd *)&ldLen,(Opnd *)autoReuseldLenDstOpnd._16_8_,instr->m_func,true);
    pIVar5 = IR::Instr::New(LdLen_A,(Opnd *)autoReuseldLenDstOpnd._16_8_,instr->m_func);
    uVar2 = autoReuseldLenDstOpnd._16_8_;
    valueType = ValueType::GetTaggedInt();
    IR::Opnd::SetValueType((Opnd *)uVar2,valueType);
    IR::Instr::InsertBefore(instr,pIVar5);
    GenerateFastRealStackArgumentsLdLen(this,pIVar5);
    uVar2 = autoReuseldLenDstOpnd._16_8_;
    compareSrc2 = IR::IntConstOpnd::New(0xf,TyUint32,this->m_func,true);
    InsertCompareBranch(this,(Opnd *)uVar2,&compareSrc2->super_Opnd,BrLt_A,true,
                        (LabelInstr *)instrNext,instr,false);
    GenerateBailOut(this,instr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&ldLen);
  }
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerBailOnNotStackArgs(IR::Instr * instr)
{
    if (!this->m_func->GetHasStackArgs())
    {
        throw Js::RejitException(RejitReason::InlineApplyDisabled);
    }

    IR::Instr * prevInstr = instr->m_prev;

    // Bail out test
    // Label to skip Bailout and continue
    IR::LabelInstr * continueLabelInstr;
    IR::Instr *instrNext = instr->m_next;
    if (instrNext->IsLabelInstr())
    {
        continueLabelInstr = instrNext->AsLabelInstr();
    }
    else
    {
        continueLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func, false);
        instr->InsertAfter(continueLabelInstr);
    }

    if (!instr->m_func->IsInlinee())
    {
        //BailOut if the number of actuals (except "this" argument) is greater than or equal to 15.
        IR::RegOpnd* ldLenDstOpnd = IR::RegOpnd::New(TyUint32, instr->m_func);
        const IR::AutoReuseOpnd autoReuseldLenDstOpnd(ldLenDstOpnd, instr->m_func);
        IR::Instr* ldLen = IR::Instr::New(Js::OpCode::LdLen_A, ldLenDstOpnd, instr->m_func);
        ldLenDstOpnd->SetValueType(ValueType::GetTaggedInt()); //LdLen_A works only on stack arguments
        instr->InsertBefore(ldLen);
        this->GenerateFastRealStackArgumentsLdLen(ldLen);
        this->InsertCompareBranch(ldLenDstOpnd, IR::IntConstOpnd::New(Js::InlineeCallInfo::MaxInlineeArgoutCount, TyUint32, m_func, true),  Js::OpCode::BrLt_A, true, continueLabelInstr, instr);
        this->GenerateBailOut(instr, nullptr, nullptr);
    }
    else
    {
        //For Inlined functions, we are sure actuals can't exceed Js::InlineeCallInfo::MaxInlineeArgoutCount (15).
        //No need to bail out.
        instr->Remove();
    }

    return prevInstr;
}